

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O0

Vector4f operator*(Matrix4f *m,Vector4f *v)

{
  float fVar1;
  float *pfVar2;
  Vector4f *in_RDX;
  float fVar3;
  ulong extraout_XMM0_Qa;
  ulong uVar5;
  Vector4f VVar6;
  undefined4 local_28;
  undefined4 local_24;
  int j;
  int i;
  Vector4f *v_local;
  Matrix4f *m_local;
  Vector4f *output;
  ulong uVar4;
  
  uVar5 = 0;
  Vector4f::Vector4f((Vector4f *)m,0.0,0.0,0.0,0.0);
  uVar4 = extraout_XMM0_Qa;
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
      pfVar2 = Matrix4f::operator()((Matrix4f *)v,local_24,local_28);
      fVar3 = *pfVar2;
      pfVar2 = Vector4f::operator[](in_RDX,local_28);
      fVar1 = *pfVar2;
      pfVar2 = Vector4f::operator[]((Vector4f *)m,local_24);
      uVar5 = (ulong)(uint)*pfVar2;
      fVar3 = fVar3 * fVar1 + *pfVar2;
      uVar4 = (ulong)(uint)fVar3;
      *pfVar2 = fVar3;
    }
  }
  VVar6.m_elements[2] = (float)(int)uVar5;
  VVar6.m_elements[3] = (float)(int)(uVar5 >> 0x20);
  VVar6.m_elements[0] = (float)(int)uVar4;
  VVar6.m_elements[1] = (float)(int)(uVar4 >> 0x20);
  return (Vector4f)VVar6.m_elements;
}

Assistant:

Vector4f operator * ( const Matrix4f& m, const Vector4f& v )
{
	Vector4f output( 0, 0, 0, 0 );

	for( int i = 0; i < 4; ++i )
	{
		for( int j = 0; j < 4; ++j )
		{
			output[ i ] += m( i, j ) * v[ j ];
		}
	}

	return output;
}